

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void cftbsub(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  int l;
  int j3;
  int j2;
  int j1;
  int j;
  double *w_local;
  double *a_local;
  int n_local;
  
  x0r._4_4_ = 2;
  if (8 < n) {
    cft1st(n,a,w);
    for (x0r._4_4_ = 8; x0r._4_4_ * 4 < n; x0r._4_4_ = x0r._4_4_ << 2) {
      cftmdl(n,x0r._4_4_,a,w);
    }
  }
  if (x0r._4_4_ << 2 == n) {
    for (j2 = 0; j2 < x0r._4_4_; j2 = j2 + 2) {
      iVar17 = j2 + x0r._4_4_;
      iVar18 = iVar17 + x0r._4_4_;
      iVar19 = iVar18 + x0r._4_4_;
      dVar1 = a[j2];
      dVar2 = a[iVar17];
      dVar3 = a[j2 + 1];
      dVar4 = a[iVar17 + 1];
      dVar5 = a[j2];
      dVar6 = a[iVar17];
      dVar7 = a[j2 + 1];
      dVar8 = a[iVar17 + 1];
      dVar9 = a[iVar18];
      dVar10 = a[iVar19];
      dVar11 = a[iVar18 + 1];
      dVar12 = a[iVar19 + 1];
      dVar13 = a[iVar18];
      dVar14 = a[iVar19];
      dVar15 = a[iVar18 + 1];
      dVar16 = a[iVar19 + 1];
      a[j2] = dVar1 + dVar2 + dVar9 + dVar10;
      a[j2 + 1] = (-dVar3 - dVar4) - (dVar11 + dVar12);
      a[iVar18] = (dVar1 + dVar2) - (dVar9 + dVar10);
      a[iVar18 + 1] = (-dVar3 - dVar4) + dVar11 + dVar12;
      a[iVar17] = (dVar5 - dVar6) - (dVar15 - dVar16);
      a[iVar17 + 1] = (-dVar7 + dVar8) - (dVar13 - dVar14);
      a[iVar19] = (dVar5 - dVar6) + (dVar15 - dVar16);
      a[iVar19 + 1] = -dVar7 + dVar8 + (dVar13 - dVar14);
    }
  }
  else {
    for (j2 = 0; j2 < x0r._4_4_; j2 = j2 + 2) {
      iVar17 = j2 + x0r._4_4_;
      dVar1 = a[j2];
      dVar2 = a[iVar17];
      dVar3 = a[j2 + 1];
      dVar4 = a[iVar17 + 1];
      a[j2] = a[iVar17] + a[j2];
      a[j2 + 1] = -a[j2 + 1] - a[iVar17 + 1];
      a[iVar17] = dVar1 - dVar2;
      a[iVar17 + 1] = -dVar3 + dVar4;
    }
  }
  return;
}

Assistant:

void cftbsub(int n, double *a, double *w)
{
    void cft1st(int n, double *a, double *w);
    void cftmdl(int n, int l, double *a, double *w);
    int j, j1, j2, j3, l;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = -a[j + 1] - a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = -a[j + 1] + a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i - x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i + x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i - x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i + x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = -a[j + 1] + a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] = -a[j + 1] - a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}